

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  int iVar3;
  char *s1;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  bool bVar15;
  undefined1 auVar16 [32];
  __m256i *palVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  parasail_result_t *result_00;
  __m256i *b;
  __m256i *palVar21;
  __m256i *b_00;
  __m256i *palVar22;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *palVar23;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *palVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  parasail_result_t *ppVar29;
  parasail_result_t *ppVar30;
  int iVar31;
  int iVar32;
  __m256i *palVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  ulong uVar38;
  __m256i *ptr;
  __m256i *palVar39;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  __m256i *ptr_03;
  __m256i *palVar55;
  __m256i *local_278;
  __m256i *local_270;
  __m256i *local_268;
  __m256i *local_260;
  __m256i *local_218;
  undefined1 local_1f8 [32];
  undefined4 local_138;
  undefined4 uStack_134;
  undefined1 local_f8 [32];
  
  s1 = profile->s1;
  ppVar4 = profile->matrix;
  result = parasail_sw_striped_profile_avx2_256_32(profile,s2,s2Len,open,gap);
  iVar18 = parasail_result_is_saturated(result);
  if (iVar18 != 0) {
    return result;
  }
  iVar18 = result->end_query;
  iVar3 = result->end_ref;
  profile_00 = parasail_profile_create_stats_avx_256_32(s1,iVar18 + 1,ppVar4);
  if (profile_00 == (parasail_profile_t *)0x0) {
    parasail_sw_stats_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar5 = (profile_00->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sw_stats_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar4 = profile_00->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar34 = profile_00->s1Len;
        uVar25 = (ulong)uVar34;
        if ((int)uVar34 < 1) {
          parasail_sw_stats_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_striped_profile_avx2_256_32_cold_4();
        }
        else if (iVar3 < 0) {
          parasail_sw_stats_striped_profile_avx2_256_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_striped_profile_avx2_256_32_cold_2();
        }
        else {
          if (-1 < gap) {
            pvVar6 = (profile_00->profile32).matches;
            pvVar7 = (profile_00->profile32).similar;
            iVar37 = ppVar4->max;
            result_00 = parasail_result_new_stats();
            ppVar30 = (parasail_result_t *)0x0;
            if (result_00 != (parasail_result_t *)0x0) {
              uVar28 = uVar25 + 7 >> 3;
              result_00->flag = result_00->flag | 0x8410804;
              b = parasail_memalign___m256i(0x20,uVar28);
              palVar21 = parasail_memalign___m256i(0x20,uVar28);
              b_00 = parasail_memalign___m256i(0x20,uVar28);
              palVar22 = parasail_memalign___m256i(0x20,uVar28);
              b_01 = parasail_memalign___m256i(0x20,uVar28);
              local_218 = parasail_memalign___m256i(0x20,uVar28);
              b_02 = parasail_memalign___m256i(0x20,uVar28);
              palVar23 = parasail_memalign___m256i(0x20,uVar28);
              b_03 = parasail_memalign___m256i(0x20,uVar28);
              b_04 = parasail_memalign___m256i(0x20,uVar28);
              b_05 = parasail_memalign___m256i(0x20,uVar28);
              b_06 = parasail_memalign___m256i(0x20,uVar28);
              local_278 = parasail_memalign___m256i(0x20,uVar28);
              local_270 = parasail_memalign___m256i(0x20,uVar28);
              palVar24 = parasail_memalign___m256i(0x20,uVar28);
              local_268 = parasail_memalign___m256i(0x20,uVar28);
              ppVar29 = (parasail_result_t *)0x0;
              ppVar30 = (parasail_result_t *)0x0;
              if ((((((b != (__m256i *)0x0) && (palVar21 != (__m256i *)0x0)) &&
                    (ppVar30 = ppVar29, b_00 != (__m256i *)0x0)) &&
                   ((palVar22 != (__m256i *)0x0 && (b_01 != (__m256i *)0x0)))) &&
                  (((local_218 != (__m256i *)0x0 &&
                    ((b_02 != (__m256i *)0x0 && (palVar23 != (__m256i *)0x0)))) &&
                   (b_03 != (__m256i *)0x0)))) &&
                 ((((b_04 != (__m256i *)0x0 && (b_05 != (__m256i *)0x0)) && (b_06 != (__m256i *)0x0)
                   ) && (((local_278 != (__m256i *)0x0 && (local_270 != (__m256i *)0x0)) &&
                         ((palVar24 != (__m256i *)0x0 && (local_268 != (__m256i *)0x0)))))))) {
                alVar1[0]._4_4_ = in_stack_fffffffffffffd6c;
                alVar1[0]._0_4_ = in_stack_fffffffffffffd68;
                alVar1[1] = (longlong)palVar23;
                alVar1[2] = (longlong)palVar22;
                alVar1[3] = (longlong)palVar24;
                parasail_memset___m256i(b,alVar1,uVar28);
                c[0]._4_4_ = in_stack_fffffffffffffd6c;
                c[0]._0_4_ = in_stack_fffffffffffffd68;
                c[1] = (longlong)palVar23;
                c[2] = (longlong)palVar22;
                c[3] = (longlong)palVar24;
                parasail_memset___m256i(b_00,c,uVar28);
                c_00[0]._4_4_ = in_stack_fffffffffffffd6c;
                c_00[0]._0_4_ = in_stack_fffffffffffffd68;
                c_00[1] = (longlong)palVar23;
                c_00[2] = (longlong)palVar22;
                c_00[3] = (longlong)palVar24;
                parasail_memset___m256i(b_01,c_00,uVar28);
                c_01[0]._4_4_ = in_stack_fffffffffffffd6c;
                c_01[0]._0_4_ = in_stack_fffffffffffffd68;
                c_01[1] = (longlong)palVar23;
                c_01[2] = (longlong)palVar22;
                c_01[3] = (longlong)palVar24;
                parasail_memset___m256i(b_02,c_01,uVar28);
                c_02[0]._4_4_ = in_stack_fffffffffffffd6c;
                c_02[0]._0_4_ = in_stack_fffffffffffffd68;
                c_02[1] = (longlong)palVar23;
                c_02[2] = (longlong)palVar22;
                c_02[3] = (longlong)palVar24;
                parasail_memset___m256i(b_03,c_02,uVar28);
                c_03[0]._4_4_ = in_stack_fffffffffffffd6c;
                c_03[0]._0_4_ = in_stack_fffffffffffffd68;
                c_03[1] = (longlong)palVar23;
                c_03[2] = (longlong)palVar22;
                c_03[3] = (longlong)palVar24;
                parasail_memset___m256i(b_04,c_03,uVar28);
                c_04[0]._4_4_ = in_stack_fffffffffffffd6c;
                c_04[0]._0_4_ = in_stack_fffffffffffffd68;
                c_04[1] = (longlong)palVar23;
                c_04[2] = (longlong)palVar22;
                c_04[3] = (longlong)palVar24;
                parasail_memset___m256i(b_05,c_04,uVar28);
                c_05[0]._4_4_ = in_stack_fffffffffffffd6c;
                c_05[0]._0_4_ = in_stack_fffffffffffffd68;
                c_05[1] = (longlong)palVar23;
                c_05[2] = (longlong)palVar22;
                c_05[3] = (longlong)palVar24;
                parasail_memset___m256i(b_06,c_05,uVar28);
                uVar14 = (uint)uVar28;
                uVar19 = uVar14 - 1;
                iVar32 = -0x40000000;
                uVar36 = 0;
                uVar38 = 0;
                auVar44 = ZEXT1664((undefined1  [16])0x0);
                local_f8 = ZEXT1632(ZEXT816(0));
                auVar45 = ZEXT1664((undefined1  [16])0x0);
                do {
                  ptr_03 = b_02;
                  local_260 = b_01;
                  palVar39 = b;
                  palVar55 = b_00;
                  lVar35 = (long)(int)(ppVar4->mapper[(byte)s2[uVar36]] * uVar14) * 0x20;
                  iVar31 = (int)uVar36 + -2;
                  b = palVar21;
                  b_01 = local_218;
                  palVar33 = local_270;
                  palVar17 = local_268;
                  b_02 = palVar23;
                  b_00 = palVar22;
                  if ((int)uVar38 == iVar31) {
                    b = local_278;
                    b_01 = palVar24;
                    palVar33 = palVar22;
                    palVar17 = palVar23;
                    b_02 = local_268;
                    b_00 = local_270;
                  }
                  local_268 = palVar17;
                  local_270 = palVar33;
                  alVar1 = ptr_03[uVar19];
                  auVar13 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  auVar42 = vpalignr_avx2((undefined1  [32])alVar1,auVar13,0xc);
                  alVar1 = local_260[uVar19];
                  auVar13 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  auVar46 = vpalignr_avx2((undefined1  [32])alVar1,auVar13,0xc);
                  alVar1 = palVar55[uVar19];
                  auVar13 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  auVar41 = vpalignr_avx2((undefined1  [32])alVar1,auVar13,0xc);
                  alVar1 = palVar39[uVar19];
                  auVar13 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  auVar13 = vpalignr_avx2((undefined1  [32])alVar1,auVar13,0xc);
                  lVar26 = 0;
                  auVar52 = ZEXT3264(CONCAT428(1,CONCAT424(1,CONCAT420(1,CONCAT416(1,CONCAT412(1,
                                                  CONCAT48(1,0x100000001)))))));
                  auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar50 = ZEXT1664((undefined1  [16])0x0);
                  do {
                    auVar51 = auVar52._0_32_;
                    auVar49 = auVar50._0_32_;
                    auVar40 = *(undefined1 (*) [32])((long)*b_03 + lVar26);
                    auVar47 = *(undefined1 (*) [32])((long)*b_04 + lVar26);
                    auVar2 = *(undefined1 (*) [32])((long)*b_05 + lVar26);
                    auVar16 = *(undefined1 (*) [32])((long)*b_06 + lVar26);
                    auVar13 = vpaddd_avx2(auVar13,*(undefined1 (*) [32])
                                                   ((long)pvVar5 + lVar26 + lVar35));
                    auVar13 = vpmaxsd_avx2(auVar13,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar11 = vpmaxsd_avx2(auVar13,auVar40);
                    auVar12 = vpmaxsd_avx2(auVar11,auVar49);
                    *(undefined1 (*) [32])((long)*b + lVar26) = auVar12;
                    auVar8 = vpcmpeqd_avx2(auVar13,auVar12);
                    auVar10 = vpcmpgtd_avx2(auVar11,auVar49);
                    auVar13 = vblendvps_avx(auVar53._0_32_,auVar47,auVar10);
                    auVar41 = vpaddd_avx2(auVar41,*(undefined1 (*) [32])
                                                   ((long)pvVar6 + lVar26 + lVar35));
                    auVar13 = vblendvps_avx(auVar13,auVar41,auVar8);
                    auVar9 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar12);
                    auVar11 = vpandn_avx2(auVar9,auVar13);
                    *(undefined1 (*) [32])((long)*b_00 + lVar26) = auVar11;
                    auVar13 = vblendvps_avx(auVar48._0_32_,auVar2,auVar10);
                    auVar41 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])
                                                   ((long)pvVar7 + lVar26 + lVar35));
                    auVar13 = vblendvps_avx(auVar13,auVar41,auVar8);
                    auVar41 = vblendvps_avx(auVar51,auVar16,auVar10);
                    auVar10 = vpcmpeqd_avx2(auVar51,auVar51);
                    auVar46 = vpsubd_avx2(auVar42,auVar10);
                    auVar41 = vblendvps_avx(auVar41,auVar46,auVar8);
                    auVar42 = vpandn_avx2(auVar9,auVar13);
                    *(undefined1 (*) [32])((long)*b_01 + lVar26) = auVar42;
                    auVar46 = vpandn_avx2(auVar9,auVar41);
                    *(undefined1 (*) [32])((long)*b_02 + lVar26) = auVar46;
                    auVar13 = vpmaxsd_avx2(auVar44._0_32_,auVar11);
                    auVar41 = vpmaxsd_avx2(auVar42,auVar46);
                    auVar13 = vpmaxsd_avx2(auVar13,auVar41);
                    auVar44 = ZEXT3264(auVar13);
                    auVar41._4_4_ = open;
                    auVar41._0_4_ = open;
                    auVar41._8_4_ = open;
                    auVar41._12_4_ = open;
                    auVar41._16_4_ = open;
                    auVar41._20_4_ = open;
                    auVar41._24_4_ = open;
                    auVar41._28_4_ = open;
                    auVar8 = vpsubd_avx2(auVar12,auVar41);
                    auVar13._4_4_ = gap;
                    auVar13._0_4_ = gap;
                    auVar13._8_4_ = gap;
                    auVar13._12_4_ = gap;
                    auVar13._16_4_ = gap;
                    auVar13._20_4_ = gap;
                    auVar13._24_4_ = gap;
                    auVar13._28_4_ = gap;
                    auVar9 = vpsubd_avx2(auVar40,auVar13);
                    auVar40 = vpcmpgtd_avx2(auVar8,auVar9);
                    auVar13 = vblendvps_avx(auVar47,auVar11,auVar40);
                    auVar41 = vpmaxsd_avx2(auVar12,auVar45._0_32_);
                    auVar45 = ZEXT3264(auVar41);
                    auVar41 = vblendvps_avx(auVar2,auVar42,auVar40);
                    auVar47 = vpsubd_avx2(auVar16,auVar10);
                    auVar12._4_4_ = gap;
                    auVar12._0_4_ = gap;
                    auVar12._8_4_ = gap;
                    auVar12._12_4_ = gap;
                    auVar12._16_4_ = gap;
                    auVar12._20_4_ = gap;
                    auVar12._24_4_ = gap;
                    auVar12._28_4_ = gap;
                    auVar54 = ZEXT3264(auVar12);
                    auVar2 = vpsubd_avx2(auVar46,auVar10);
                    auVar46 = vblendvps_avx(auVar47,auVar2,auVar40);
                    auVar40 = vpmaxsd_avx2(auVar8,auVar9);
                    *(undefined1 (*) [32])((long)*b_03 + lVar26) = auVar40;
                    *(undefined1 (*) [32])((long)*b_04 + lVar26) = auVar13;
                    *(undefined1 (*) [32])((long)*b_05 + lVar26) = auVar41;
                    *(undefined1 (*) [32])((long)*b_06 + lVar26) = auVar46;
                    auVar46 = vpsubd_avx2(auVar49,auVar12);
                    auVar41 = vpcmpgtd_avx2(auVar8,auVar46);
                    auVar13 = vblendvps_avx(auVar53._0_32_,auVar11,auVar41);
                    auVar53 = ZEXT3264(auVar13);
                    auVar13 = vpmaxsd_avx2(auVar8,auVar46);
                    auVar50 = ZEXT3264(auVar13);
                    auVar13 = vblendvps_avx(auVar48._0_32_,auVar42,auVar41);
                    auVar48 = ZEXT3264(auVar13);
                    auVar13 = vpsubd_avx2(auVar51,auVar10);
                    auVar13 = vblendvps_avx(auVar13,auVar2,auVar41);
                    auVar52 = ZEXT3264(auVar13);
                    auVar13 = *(undefined1 (*) [32])((long)*palVar39 + lVar26);
                    auVar41 = *(undefined1 (*) [32])((long)*palVar55 + lVar26);
                    auVar46 = *(undefined1 (*) [32])((long)*local_260 + lVar26);
                    auVar42 = *(undefined1 (*) [32])((long)*ptr_03 + lVar26);
                    lVar26 = lVar26 + 0x20;
                  } while (uVar28 << 5 != lVar26);
                  if ((int)uVar38 == iVar31) {
                    local_278 = palVar21;
                    palVar24 = local_218;
                  }
                  iVar31 = 0;
                  auVar43 = ZEXT3264(CONCAT428(open,CONCAT424(open,CONCAT420(open,CONCAT416(open,
                                                  CONCAT412(open,CONCAT48(open,CONCAT44(open,open)))
                                                  )))));
                  do {
                    auVar13 = vpermps_avx2(_DAT_008d4780,auVar52._0_32_);
                    auVar41 = vblendps_avx(auVar13,ZEXT432(1),1);
                    auVar46 = auVar48._0_32_;
                    auVar13 = vperm2f128_avx(auVar46,auVar46,0x28);
                    auVar13 = vpalignr_avx2(auVar46,auVar13,0xc);
                    auVar48 = ZEXT3264(auVar13);
                    auVar46 = auVar53._0_32_;
                    auVar13 = vperm2f128_avx(auVar46,auVar46,0x28);
                    auVar13 = vpalignr_avx2(auVar46,auVar13,0xc);
                    auVar53 = ZEXT3264(auVar13);
                    auVar13 = vpermps_avx2(_DAT_008d4780,auVar50._0_32_);
                    local_1f8 = vblendps_avx(auVar13,ZEXT432((uint)-open),1);
                    alVar1 = palVar39[uVar19];
                    auVar13 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28
                                             );
                    auVar13 = vpalignr_avx2((undefined1  [32])alVar1,auVar13,0xc);
                    lVar26 = 0;
                    do {
                      auVar13 = vpaddd_avx2(auVar13,*(undefined1 (*) [32])
                                                     ((long)pvVar5 + lVar26 + lVar35));
                      auVar13 = vpmaxsd_avx2(auVar13,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      auVar46 = *(undefined1 (*) [32])((long)*b + lVar26);
                      auVar8 = vpmaxsd_avx2(auVar46,local_1f8);
                      *(undefined1 (*) [32])((long)*b + lVar26) = auVar8;
                      auVar42 = vpcmpeqd_avx2(auVar8,auVar13);
                      auVar46 = vpcmpgtd_avx2(auVar46,local_1f8);
                      auVar40 = vpor_avx2(auVar42,auVar46);
                      auVar46 = vblendvps_avx(auVar53._0_32_,
                                              *(undefined1 (*) [32])((long)*b_00 + lVar26),auVar40);
                      *(undefined1 (*) [32])((long)*b_00 + lVar26) = auVar46;
                      auVar47 = auVar48._0_32_;
                      auVar42 = vblendvps_avx(auVar47,*(undefined1 (*) [32])((long)*b_01 + lVar26),
                                              auVar40);
                      *(undefined1 (*) [32])((long)*b_01 + lVar26) = auVar42;
                      auVar40 = vblendvps_avx(auVar41,*(undefined1 (*) [32])((long)*b_02 + lVar26),
                                              auVar40);
                      auVar9 = vpsubd_avx2(auVar8,auVar43._0_32_);
                      auVar10 = vpsubd_avx2(local_1f8,auVar54._0_32_);
                      auVar2 = vpcmpeqd_avx2(auVar10,auVar9);
                      auVar11 = vpcmpgtd_avx2(auVar10,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      auVar2 = vpand_avx2(auVar2,auVar11);
                      auVar11 = vpcmpgtd_avx2(auVar10,auVar9);
                      auVar2 = vpor_avx2(auVar2,auVar11);
                      *(undefined1 (*) [32])((long)*b_02 + lVar26) = auVar40;
                      if ((((((((auVar2 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar2 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                              (auVar2 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             SUB321(auVar2 >> 0x7f,0) == '\0') &&
                            (auVar2 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar2 >> 0xbf,0) == '\0') &&
                          (auVar2 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar2[0x1f]) {
                        iVar20 = 0x1e;
                      }
                      else {
                        auVar11 = vpcmpgtd_avx2(auVar9,auVar10);
                        auVar13 = vblendvps_avx(auVar53._0_32_,auVar46,auVar11);
                        auVar53 = ZEXT3264(auVar13);
                        auVar47 = vblendvps_avx(auVar47,auVar42,auVar11);
                        auVar13 = vblendvps_avx(auVar41,auVar40,auVar11);
                        auVar41 = vpsubd_avx2(auVar13,_DAT_008d4ac0);
                        auVar13 = *(undefined1 (*) [32])((long)*palVar39 + lVar26);
                        iVar20 = 0;
                        local_1f8 = auVar10;
                      }
                      auVar46 = vpmaxsd_avx2(auVar44._0_32_,auVar46);
                      auVar42 = vpmaxsd_avx2(auVar42,auVar40);
                      auVar46 = vpmaxsd_avx2(auVar46,auVar42);
                      auVar44 = ZEXT3264(auVar46);
                      auVar42 = vpmaxsd_avx2(auVar8,auVar45._0_32_);
                      auVar45 = ZEXT3264(auVar42);
                      auVar43 = ZEXT3264(CONCAT428(open,CONCAT424(open,CONCAT420(open,CONCAT416(open
                                                  ,CONCAT412(open,CONCAT48(open,CONCAT44(open,open))
                                                            ))))));
                      auVar54 = ZEXT3264(CONCAT428(gap,CONCAT424(gap,CONCAT420(gap,CONCAT416(gap,
                                                  CONCAT412(gap,CONCAT48(gap,CONCAT44(gap,gap)))))))
                                        );
                      auVar48 = ZEXT3264(auVar47);
                      if ((((((((((((((((((((((((((((((((auVar2 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar2 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar2 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar2 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar2 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar2 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar2 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar2 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar2 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar2 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar2 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar2 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar2 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar2 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar2 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) && SUB321(auVar2 >> 0x7f,0) == '\0'
                                         ) && (auVar2 >> 0x87 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                       (auVar2 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar2 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar2 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar2 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar2 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar2 >> 0xb7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar2 >> 0xbf,0) == '\0')
                                && (auVar2 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar2 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar2 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar2 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar2 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar2 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar2 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar2[0x1f]) goto LAB_007750e2;
                      lVar26 = lVar26 + 0x20;
                    } while (uVar28 << 5 != lVar26);
                    iVar20 = 0;
LAB_007750e2:
                    if (iVar20 != 0) {
                      if (iVar20 != 0x1e) {
                        bVar15 = false;
                        goto LAB_00775197;
                      }
                      break;
                    }
                    auVar52 = ZEXT3264(auVar41);
                    iVar31 = iVar31 + 1;
                    auVar50 = ZEXT3264(local_1f8);
                  } while (iVar31 != 8);
                  auVar13 = vpcmpgtd_avx2(auVar42,local_f8);
                  bVar15 = true;
                  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar13 >> 0x7f,0) != '\0') ||
                        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar13 >> 0xbf,0) != '\0') ||
                      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar13[0x1f] < '\0') {
                    auVar13 = vpermq_avx2(auVar42,0x44);
                    auVar13 = vpmaxsd_avx2(auVar42,auVar13);
                    auVar41 = vpslldq_avx2(auVar13,8);
                    auVar13 = vpmaxsd_avx2(auVar13,auVar41);
                    auVar41 = vpslldq_avx2(auVar13,4);
                    auVar13 = vpmaxsd_avx2(auVar13,auVar41);
                    iVar32 = auVar13._28_4_;
                    if (0x7ffffffe - iVar37 < iVar32) {
                      *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                      bVar15 = false;
                    }
                    else {
                      auVar42._8_4_ = 7;
                      auVar42._0_8_ = 0x700000007;
                      auVar42._12_4_ = 7;
                      auVar42._16_4_ = 7;
                      auVar42._20_4_ = 7;
                      auVar42._24_4_ = 7;
                      auVar42._28_4_ = 7;
                      local_f8 = vpermd_avx2(auVar42,auVar13);
                      uVar38 = uVar36 & 0xffffffff;
                    }
                  }
LAB_00775197:
                  if (!bVar15) goto LAB_007751be;
                  uVar36 = uVar36 + 1;
                  palVar21 = palVar39;
                  palVar22 = palVar55;
                  palVar23 = ptr_03;
                  local_218 = local_260;
                } while (uVar36 != iVar3 + 1U);
                uVar36 = (ulong)(iVar3 + 1U);
LAB_007751be:
                iVar37 = (int)uVar38;
                if ((iVar32 == 0x7fffffff) ||
                   (auVar40._8_4_ = 0x7fffffff, auVar40._0_8_ = 0x7fffffff7fffffff,
                   auVar40._12_4_ = 0x7fffffff, auVar40._16_4_ = 0x7fffffff,
                   auVar40._20_4_ = 0x7fffffff, auVar40._24_4_ = 0x7fffffff,
                   auVar40._28_4_ = 0x7fffffff, auVar13 = vpcmpeqd_avx2(auVar46,auVar40),
                   (((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar13 >> 0x7f,0) != '\0') ||
                     (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar13 >> 0xbf,0) != '\0') ||
                   (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar13[0x1f] < '\0')) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                }
                iVar20 = parasail_result_is_saturated(result_00);
                iVar31 = 0;
                palVar21 = palVar55;
                palVar22 = palVar39;
                if (iVar20 == 0) {
                  local_1f8._0_8_ = b_00;
                  palVar23 = local_270;
                  palVar33 = b;
                  palVar17 = b_02;
                  ptr = b_01;
                  ptr_00 = local_278;
                  ptr_01 = palVar24;
                  ptr_02 = local_268;
                  if ((iVar37 != (int)uVar36 + -1) &&
                     (local_1f8._0_8_ = local_270, palVar23 = b_00, palVar33 = local_278,
                     palVar17 = local_268, ptr = palVar24, ptr_00 = b, ptr_01 = b_01, ptr_02 = b_02,
                     iVar37 == (int)uVar36 + -2)) {
                    palVar21 = local_270;
                    local_1f8._0_8_ = palVar55;
                    palVar22 = local_278;
                    palVar33 = palVar39;
                    palVar17 = ptr_03;
                    ptr = local_260;
                    ptr_03 = local_268;
                    local_260 = palVar24;
                  }
                  local_268 = palVar17;
                  local_138 = SUB84(palVar33,0);
                  uStack_134 = (undefined4)((ulong)palVar33 >> 0x20);
                  if ((uVar25 + 7 & 0x7ffffff8) == 0) {
                    iVar31 = -0x40000000;
                    iVar27 = -0x40000000;
                    iVar20 = -0x40000000;
                  }
                  else {
                    iVar20 = -0x40000000;
                    uVar28 = 0;
                    iVar27 = -0x40000000;
                    iVar31 = -0x40000000;
                    do {
                      if ((*(int *)((long)*palVar33 + uVar28 * 4) == iVar32) &&
                         (uVar34 = ((uint)uVar28 & 7) * uVar14 + ((uint)(uVar28 >> 3) & 0x1fffffff),
                         (int)uVar34 < (int)uVar25)) {
                        iVar20 = *(int *)((long)*(__m256i *)local_1f8._0_8_ + uVar28 * 4);
                        iVar31 = *(int *)((long)*ptr + uVar28 * 4);
                        iVar27 = *(int *)((long)*local_268 + uVar28 * 4);
                        uVar25 = (ulong)uVar34;
                      }
                      uVar34 = (uint)uVar25;
                      uVar28 = uVar28 + 1;
                    } while ((uVar14 & 0xfffffff) << 3 != (int)uVar28);
                  }
                }
                else {
                  iVar27 = 0;
                  iVar20 = 0;
                  iVar32 = 0;
                  local_138 = SUB84(local_278,0);
                  uStack_134 = (undefined4)((ulong)local_278 >> 0x20);
                  iVar37 = 0;
                  uVar34 = 0;
                  palVar23 = b_00;
                  ptr = palVar24;
                  ptr_00 = b;
                  ptr_01 = b_01;
                  ptr_02 = b_02;
                  local_1f8._0_8_ = local_270;
                }
                result_00->score = iVar32;
                result_00->end_query = uVar34;
                result_00->end_ref = iVar37;
                ((result_00->field_4).stats)->matches = iVar20;
                ((result_00->field_4).stats)->similar = iVar31;
                ((result_00->field_4).stats)->length = iVar27;
                parasail_free(local_268);
                parasail_free(ptr);
                parasail_free((void *)local_1f8._0_8_);
                parasail_free((void *)CONCAT44(uStack_134,local_138));
                parasail_free(b_06);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(local_260);
                parasail_free(ptr_01);
                parasail_free(palVar21);
                parasail_free(palVar23);
                parasail_free(palVar22);
                parasail_free(ptr_00);
                ppVar30 = result_00;
              }
            }
            goto LAB_0077548e;
          }
          parasail_sw_stats_striped_profile_avx2_256_32_cold_1();
        }
      }
    }
  }
  ppVar30 = (parasail_result_t *)0x0;
LAB_0077548e:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  ppVar30->end_query = iVar18;
  ppVar30->end_ref = iVar3;
  return ppVar30;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_avx2_256_32(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_avx_256_32(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_avx2_256_32(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_avx_256_32(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_avx_256_32(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}